

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

void __thiscall BPlusTree<int>::BPlusTree(BPlusTree<int> *this,bool dupes_allowed)

{
  this->data_size = 0;
  this->subset_size = 0;
  b_array::Array<int>::Array(&this->data,3);
  b_array::Array<BPlusTree<int>_*>::Array(&this->subset,4);
  this->duplicates_allowed = dupes_allowed;
  this->next = (BPlusTree<int> *)0x0;
  return;
}

Assistant:

BPlusTree<T>::BPlusTree(bool dupes_allowed) : duplicates_allowed(dupes_allowed) {}